

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mem.c
# Opt level: O2

int read_file(char *file,uint8_t **data,size_t *size)

{
  int iVar1;
  FILE *__stream;
  uint8_t *__ptr;
  size_t sVar2;
  stat info;
  
  __stream = fopen(file,"rb");
  stat(file,(stat *)&info);
  __ptr = (uint8_t *)calloc(info.st_size,1);
  *data = __ptr;
  sVar2 = fread(__ptr,1,info.st_size,__stream);
  if (sVar2 == info.st_size) {
    fclose(__stream);
    *size = info.st_size;
    iVar1 = 0;
  }
  else {
    free(*data);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int read_file(const char *file, uint8_t **data, size_t *size)
{
	size_t tmp;
	struct stat info;
	FILE *f;

	f = fopen(file, "rb");
	stat(file, &info);
	*data = calloc(info.st_size, 1);
	tmp = fread(*data, 1, info.st_size, f);
	if (tmp != info.st_size) {
		free(*data);
		return -1;
	}

	fclose(f);
	*size = info.st_size;
	return 0;
}